

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool cmDependsFortranParser_FilePush(cmDependsFortranParser *parser,char *fname)

{
  FILE *pFVar1;
  YY_BUFFER_STATE new_buffer;
  YY_BUFFER_STATE buffer;
  cmDependsFortranFile f;
  string local_a8;
  undefined1 local_88 [8];
  string dir;
  YY_BUFFER_STATE current;
  allocator local_49;
  string local_48;
  FILE *local_28;
  FILE *file;
  char *fname_local;
  cmDependsFortranParser *parser_local;
  
  file = (FILE *)fname;
  fname_local = (char *)parser;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,fname,&local_49);
  pFVar1 = cmsys::SystemTools::Fopen(&local_48,"rb");
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (pFVar1 == (FILE *)0x0) {
    parser_local._7_1_ = 0;
  }
  else {
    local_28 = pFVar1;
    dir.field_2._8_8_ = cmDependsFortranLexer_GetCurrentBuffer(*(yyscan_t *)(fname_local + 8));
    pFVar1 = file;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a8,(char *)pFVar1,
               (allocator *)(f.Directory.field_2._M_local_buf + 0xf));
    cmsys::SystemTools::GetParentDirectory((string *)local_88,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)(f.Directory.field_2._M_local_buf + 0xf));
    cmDependsFortranFile::cmDependsFortranFile
              ((cmDependsFortranFile *)&buffer,local_28,(YY_BUFFER_STATE)dir.field_2._8_8_,
               (string *)local_88);
    new_buffer = cmDependsFortran_yy_create_buffer
                           ((FILE *)0x0,0x4000,*(yyscan_t *)(fname_local + 8));
    cmDependsFortran_yy_switch_to_buffer(new_buffer,*(yyscan_t *)(fname_local + 8));
    std::
    stack<cmDependsFortranFile,_std::deque<cmDependsFortranFile,_std::allocator<cmDependsFortranFile>_>_>
    ::push((stack<cmDependsFortranFile,_std::deque<cmDependsFortranFile,_std::allocator<cmDependsFortranFile>_>_>
            *)(fname_local + 0x10),(value_type *)&buffer);
    parser_local._7_1_ = 1;
    cmDependsFortranFile::~cmDependsFortranFile((cmDependsFortranFile *)&buffer);
    std::__cxx11::string::~string((string *)local_88);
  }
  return (bool)(parser_local._7_1_ & 1);
}

Assistant:

bool cmDependsFortranParser_FilePush(cmDependsFortranParser* parser,
                                    const char* fname)
{
  // Open the new file and push it onto the stack.  Save the old
  // buffer with it on the stack.
  if(FILE* file = cmsys::SystemTools::Fopen(fname, "rb"))
    {
    YY_BUFFER_STATE current =
      cmDependsFortranLexer_GetCurrentBuffer(parser->Scanner);
    std::string dir = cmSystemTools::GetParentDirectory(fname);
    cmDependsFortranFile f(file, current, dir);
    YY_BUFFER_STATE buffer =
      cmDependsFortran_yy_create_buffer(0, 16384, parser->Scanner);
    cmDependsFortran_yy_switch_to_buffer(buffer, parser->Scanner);
    parser->FileStack.push(f);
    return 1;
    }
  else
    {
    return 0;
    }
}